

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O1

StringEnumeration *
icu_63::TimeZoneNamesImpl::_getAvailableMetaZoneIDs(UnicodeString *tzID,UErrorCode *status)

{
  UErrorCode UVar1;
  int32_t iVar2;
  UVector *this;
  UVector *this_00;
  undefined8 *puVar3;
  StringEnumeration *pSVar4;
  int index;
  UErrorCode *size;
  UErrorCode *obj;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    size = status;
    this = ZoneMeta::getMetazoneMappings(tzID);
    if (this == (UVector *)0x0) {
      pSVar4 = (StringEnumeration *)UMemory::operator_new((UMemory *)0x90,(size_t)size);
      if (pSVar4 != (StringEnumeration *)0x0) {
        StringEnumeration::StringEnumeration(pSVar4);
        (pSVar4->super_UObject)._vptr_UObject = (_func_int **)&PTR__MetaZoneIDsEnumeration_003a7140;
        *(undefined8 *)&pSVar4->field_0x74 = 0;
        pSVar4[1].unistr.super_Replaceable.super_UObject._vptr_UObject = (_func_int **)0x0;
        *(undefined8 *)&pSVar4[1].unistr.fUnion = 0;
        return pSVar4;
      }
    }
    else {
      this_00 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)size);
      if (this_00 == (UVector *)0x0) {
        this_00 = (UVector *)0x0;
      }
      else {
        size = (UErrorCode *)0x0;
        UVector::UVector(this_00,(UObjectDeleter *)0x0,uhash_compareUChars_63,status);
      }
      if (this_00 == (UVector *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        UVar1 = *status;
        if (UVar1 < U_ILLEGAL_ARGUMENT_ERROR) {
          if (0 < this->count) {
            index = 0;
            do {
              puVar3 = (undefined8 *)UVector::elementAt(this,index);
              obj = (UErrorCode *)*puVar3;
              size = obj;
              iVar2 = UVector::indexOf(this_00,obj,0);
              if (iVar2 < 0) {
                UVector::addElement(this_00,obj,status);
                size = obj;
              }
              UVar1 = *status;
              if (U_ZERO_ERROR < UVar1) goto LAB_001fd57c;
              index = index + 1;
            } while (index < this->count);
          }
          if (UVar1 < U_ILLEGAL_ARGUMENT_ERROR) {
            pSVar4 = (StringEnumeration *)UMemory::operator_new((UMemory *)0x90,(size_t)size);
            if (pSVar4 == (StringEnumeration *)0x0) {
              return (StringEnumeration *)0x0;
            }
            StringEnumeration::StringEnumeration(pSVar4);
            (pSVar4->super_UObject)._vptr_UObject =
                 (_func_int **)&PTR__MetaZoneIDsEnumeration_003a7140;
            *(undefined8 *)&pSVar4->field_0x74 = 0;
            pSVar4[1].unistr.super_Replaceable.super_UObject._vptr_UObject = (_func_int **)this_00;
            *(UVector **)&pSVar4[1].unistr.fUnion = this_00;
            if (this_00 != (UVector *)0x0) {
              *(int32_t *)&pSVar4->field_0x74 = this_00->count;
              return pSVar4;
            }
            return pSVar4;
          }
        }
LAB_001fd57c:
        if (this_00 != (UVector *)0x0) {
          (*(this_00->super_UObject)._vptr_UObject[1])(this_00);
        }
      }
    }
  }
  return (StringEnumeration *)0x0;
}

Assistant:

const UChar* getName(UTimeZoneNameType type) const {
        UTimeZoneNameTypeIndex index = getTZNameTypeIndex(type);
        return index >= 0 ? fNames[index] : NULL;
    }